

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  size_type sVar2;
  reference top_blob_00;
  Option *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  Option *in_stack_00000010;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000018;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000020;
  Gemm *in_stack_00000028;
  Mat *top_blob;
  int broadcast_type_C;
  Mat C;
  int N;
  int M;
  int j_1;
  float *ptr_1;
  int i_1;
  int B0_hstep;
  Mat BT;
  int j;
  float *ptr;
  int i;
  int A0_hstep;
  Mat A;
  size_t elemsize;
  Mat *B0;
  Mat *A0;
  Allocator *in_stack_fffffffffffffad8;
  Allocator *in_stack_fffffffffffffae0;
  size_t in_stack_fffffffffffffae8;
  int _w;
  value_type *pvVar4;
  Mat *in_stack_fffffffffffffaf0;
  int _c;
  undefined8 in_stack_fffffffffffffaf8;
  int _w_00;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  int local_488;
  int local_484;
  int local_460;
  int local_440;
  const_reference local_420;
  const_reference local_418;
  const_reference local_410;
  int local_3ec;
  value_type local_3e8;
  int local_39c;
  int local_398;
  int local_394;
  void *local_390;
  int local_388;
  int local_384;
  value_type local_380;
  int local_334;
  void *local_330;
  int local_324;
  int local_320;
  value_type local_310;
  size_t local_2c8;
  const_reference local_2c0;
  const_reference local_2b8;
  Option *local_2b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2a0;
  int local_28c;
  value_type *local_288;
  value_type *local_280;
  value_type *local_278;
  value_type *local_270;
  value_type *local_260;
  value_type *local_250;
  int local_240;
  undefined4 local_23c;
  const_reference local_238;
  const_reference local_230;
  const_reference local_228;
  int local_220;
  undefined4 local_21c;
  const_reference local_218;
  const_reference local_210;
  const_reference local_208;
  int local_200;
  undefined4 local_1fc;
  const_reference local_1f8;
  const_reference local_1f0;
  const_reference local_1e8;
  int local_1e0;
  undefined4 local_1dc;
  value_type *local_1d8;
  value_type *local_1d0;
  value_type *local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  const_reference local_1b8;
  const_reference local_1b0;
  const_reference local_1a8;
  int local_1a0;
  undefined4 local_19c;
  const_reference local_198;
  const_reference local_190;
  const_reference local_188;
  reference local_180;
  value_type *local_178;
  int local_16c;
  value_type *local_168;
  int local_15c;
  value_type *local_158;
  long local_150;
  const_reference local_148;
  long local_140;
  const_reference local_138;
  const_reference local_128;
  const_reference local_118;
  value_type *local_108;
  int local_100;
  undefined4 local_fc;
  const_reference local_f8;
  int local_f0;
  undefined4 local_ec;
  const_reference local_e8;
  int local_e0;
  undefined4 local_dc;
  const_reference local_d8;
  int local_c0;
  undefined4 local_bc;
  value_type *local_b8;
  int local_a0;
  undefined4 local_9c;
  value_type *local_98;
  int local_80;
  undefined4 local_7c;
  value_type *local_78;
  void *local_70;
  void *local_60;
  void *local_50;
  void *local_40;
  void *local_38;
  void *local_30;
  value_type *local_10;
  reference local_8;
  
  if (*(int *)(in_RDI + 0x10c) == 0) {
    local_2b0 = in_RCX;
    local_2a8 = in_RDX;
    local_2a0 = in_RSI;
    if (*(int *)(in_RDI + 0xe0) == 0) {
      local_410 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    }
    else {
      local_410 = (const_reference)(in_RDI + 0x120);
    }
    local_2b8 = local_410;
    if (*(int *)(in_RDI + 0xe4) == 0) {
      if (*(int *)(in_RDI + 0xe0) == 0) {
        local_420 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a0,1);
      }
      else {
        local_420 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a0,0);
      }
      local_418 = local_420;
    }
    else {
      local_418 = (const_reference)(in_RDI + 0x168);
    }
    local_2c0 = local_418;
    local_2c8 = local_2b8->elemsize;
    local_288 = &local_310;
    local_310.data = (void *)0x0;
    local_310.refcount = (int *)0x0;
    local_310.elemsize = 0;
    local_310.elempack = 0;
    local_310.allocator = (Allocator *)0x0;
    local_310.dims = 0;
    local_310.w = 0;
    local_310.h = 0;
    local_310.d = 0;
    local_310.c = 0;
    local_310.cstep = 0;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      local_190 = &local_310;
      if (local_190 != local_2b8) {
        if (local_2b8->refcount != (int *)0x0) {
          piVar1 = local_2b8->refcount;
          local_19c = 1;
          LOCK();
          local_1a0 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_310.data = local_2b8->data;
        local_310.refcount = local_2b8->refcount;
        local_310.elemsize = local_2b8->elemsize;
        local_310.elempack = local_2b8->elempack;
        local_310.allocator = local_2b8->allocator;
        local_310.dims = local_2b8->dims;
        local_310.h = local_2b8->h;
        local_310.d = local_2b8->d;
        local_310.c = local_2b8->c;
        local_310.cstep = local_2b8->cstep;
        local_128 = local_190;
      }
      local_198 = local_2b8;
      local_188 = local_190;
    }
    else {
      Mat::create(in_stack_fffffffffffffaf0,(int)(in_stack_fffffffffffffae8 >> 0x20),
                  (int)in_stack_fffffffffffffae8,(size_t)in_stack_fffffffffffffae0,
                  in_stack_fffffffffffffad8);
      if (local_2b8->dims == 3) {
        local_440 = (int)local_2b8->cstep;
      }
      else {
        local_440 = local_2b8->w;
      }
      local_320 = local_440;
      for (local_324 = 0; local_324 < local_310.h; local_324 = local_324 + 1) {
        local_15c = local_324;
        local_158 = &local_310;
        local_330 = (void *)((long)local_310.data +
                            (long)local_310.w * (long)local_324 * local_310.elemsize);
        for (local_334 = 0; local_334 < local_310.w; local_334 = local_334 + 1) {
          local_138 = local_2b8;
          local_140 = (long)(local_334 * local_440 + local_324);
          *(undefined4 *)((long)local_330 + (long)local_334 * 4) =
               *(undefined4 *)((long)local_2b8->data + local_140 * 4);
        }
      }
    }
    local_280 = &local_380;
    local_380.data = (void *)0x0;
    local_380.refcount = (int *)0x0;
    local_380.elemsize = 0;
    local_380.elempack = 0;
    local_380.allocator = (Allocator *)0x0;
    local_380.dims = 0;
    local_380.w = 0;
    local_380.h = 0;
    local_380.d = 0;
    local_380.c = 0;
    local_380.cstep = 0;
    if (*(int *)(in_RDI + 0xdc) == 0) {
      Mat::create(in_stack_fffffffffffffaf0,(int)(in_stack_fffffffffffffae8 >> 0x20),
                  (int)in_stack_fffffffffffffae8,(size_t)in_stack_fffffffffffffae0,
                  in_stack_fffffffffffffad8);
      if (local_2c0->dims == 3) {
        local_460 = (int)local_2c0->cstep;
      }
      else {
        local_460 = local_2c0->w;
      }
      local_384 = local_460;
      for (local_388 = 0; local_388 < local_380.h; local_388 = local_388 + 1) {
        local_16c = local_388;
        local_168 = &local_380;
        local_390 = (void *)((long)local_380.data +
                            (long)local_380.w * (long)local_388 * local_380.elemsize);
        for (local_394 = 0; local_394 < local_380.w; local_394 = local_394 + 1) {
          local_148 = local_2c0;
          local_150 = (long)(local_394 * local_460 + local_388);
          *(undefined4 *)((long)local_390 + (long)local_394 * 4) =
               *(undefined4 *)((long)local_2c0->data + local_150 * 4);
        }
      }
    }
    else {
      local_1b0 = &local_380;
      if (local_1b0 != local_2c0) {
        if (local_2c0->refcount != (int *)0x0) {
          piVar1 = local_2c0->refcount;
          local_1bc = 1;
          LOCK();
          local_1c0 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_380.data = local_2c0->data;
        local_380.refcount = local_2c0->refcount;
        local_380.elemsize = local_2c0->elemsize;
        local_380.elempack = local_2c0->elempack;
        local_380.allocator = local_2c0->allocator;
        local_380.dims = local_2c0->dims;
        local_380.h = local_2c0->h;
        local_380.d = local_2c0->d;
        local_380.c = local_2c0->c;
        local_380.cstep = local_2c0->cstep;
        local_118 = local_1b0;
      }
      local_1b8 = local_2c0;
      local_1a8 = local_1b0;
    }
    if (local_310.dims == 3) {
      local_484 = local_310.c;
    }
    else {
      local_484 = local_310.h;
    }
    local_398 = local_484;
    if (local_380.dims == 3) {
      local_488 = local_380.c;
    }
    else {
      local_488 = local_380.h;
    }
    local_39c = local_488;
    local_278 = &local_3e8;
    local_3e8.data = (void *)0x0;
    local_3e8.refcount = (int *)0x0;
    local_3e8.elemsize = 0;
    local_3e8.elempack = 0;
    local_3e8.allocator = (Allocator *)0x0;
    local_3e8.dims = 0;
    local_3e8.w = 0;
    local_3e8.h = 0;
    local_3e8.d = 0;
    local_3e8.c = 0;
    local_3e8.cstep = 0;
    local_3ec = 0;
    if (*(int *)(in_RDI + 0xe8) == 0) {
      if (((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) ||
         (sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2a0), sVar2 != 1))
      {
        if (((*(int *)(in_RDI + 0xe0) == 0) && (*(int *)(in_RDI + 0xe4) == 0)) ||
           (sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2a0), sVar2 != 2)
           ) {
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2a0);
          if (sVar2 == 3) {
            local_238 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a0,2);
            local_230 = &local_3e8;
            local_228 = &local_3e8;
            if (&local_3e8 != local_238) {
              if (local_238->refcount != (int *)0x0) {
                piVar1 = local_238->refcount;
                local_23c = 1;
                LOCK();
                local_240 = *piVar1;
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              local_d8 = &local_3e8;
              if (local_3e8.refcount != (int *)0x0) {
                local_dc = 0xffffffff;
                LOCK();
                local_e0 = *local_3e8.refcount;
                *local_3e8.refcount = *local_3e8.refcount + -1;
                UNLOCK();
                if (local_e0 == 1) {
                  if (local_3e8.allocator == (Allocator *)0x0) {
                    local_40 = local_3e8.data;
                    if (local_3e8.data != (void *)0x0) {
                      free(local_3e8.data);
                    }
                  }
                  else {
                    (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data)
                    ;
                  }
                }
              }
              local_3e8.data = local_238->data;
              local_3e8.refcount = local_238->refcount;
              local_3e8.elemsize = local_238->elemsize;
              local_3e8.elempack = local_238->elempack;
              local_3e8.allocator = local_238->allocator;
              local_3e8.dims = local_238->dims;
              local_3e8.w = local_238->w;
              local_3e8.h = local_238->h;
              local_3e8.d = local_238->d;
              local_3e8.c = local_238->c;
              local_3e8.cstep = local_238->cstep;
            }
          }
        }
        else {
          local_218 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a0,1);
          local_210 = &local_3e8;
          local_208 = &local_3e8;
          if (&local_3e8 != local_218) {
            if (local_218->refcount != (int *)0x0) {
              piVar1 = local_218->refcount;
              local_21c = 1;
              LOCK();
              local_220 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            local_e8 = &local_3e8;
            if (local_3e8.refcount != (int *)0x0) {
              local_ec = 0xffffffff;
              LOCK();
              local_f0 = *local_3e8.refcount;
              *local_3e8.refcount = *local_3e8.refcount + -1;
              UNLOCK();
              if (local_f0 == 1) {
                if (local_3e8.allocator == (Allocator *)0x0) {
                  local_38 = local_3e8.data;
                  if (local_3e8.data != (void *)0x0) {
                    free(local_3e8.data);
                  }
                }
                else {
                  (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
                }
              }
            }
            local_3e8.data = local_218->data;
            local_3e8.refcount = local_218->refcount;
            local_3e8.elemsize = local_218->elemsize;
            local_3e8.elempack = local_218->elempack;
            local_3e8.allocator = local_218->allocator;
            local_3e8.dims = local_218->dims;
            local_3e8.w = local_218->w;
            local_3e8.h = local_218->h;
            local_3e8.d = local_218->d;
            local_3e8.c = local_218->c;
            local_3e8.cstep = local_218->cstep;
          }
        }
      }
      else {
        local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a0,0);
        local_1f0 = &local_3e8;
        local_1e8 = &local_3e8;
        if (&local_3e8 != local_1f8) {
          if (local_1f8->refcount != (int *)0x0) {
            piVar1 = local_1f8->refcount;
            local_1fc = 1;
            LOCK();
            local_200 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_f8 = &local_3e8;
          if (local_3e8.refcount != (int *)0x0) {
            local_fc = 0xffffffff;
            LOCK();
            local_100 = *local_3e8.refcount;
            *local_3e8.refcount = *local_3e8.refcount + -1;
            UNLOCK();
            if (local_100 == 1) {
              if (local_3e8.allocator == (Allocator *)0x0) {
                local_30 = local_3e8.data;
                if (local_3e8.data != (void *)0x0) {
                  free(local_3e8.data);
                }
              }
              else {
                (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
              }
            }
          }
          local_3e8.data = local_1f8->data;
          local_3e8.refcount = local_1f8->refcount;
          local_3e8.elemsize = local_1f8->elemsize;
          local_3e8.elempack = local_1f8->elempack;
          local_3e8.allocator = local_1f8->allocator;
          local_3e8.dims = local_1f8->dims;
          local_3e8.w = local_1f8->w;
          local_3e8.h = local_1f8->h;
          local_3e8.d = local_1f8->d;
          local_3e8.c = local_1f8->c;
          local_3e8.cstep = local_1f8->cstep;
        }
      }
      local_178 = &local_3e8;
      if (local_3e8.data != (void *)0x0) {
        local_10 = local_178;
      }
      if (local_3e8.data != (void *)0x0 && local_3e8.cstep * (long)local_3e8.c != 0) {
        local_3ec = 0;
        if ((local_3e8.dims == 1) && (local_3e8.w == local_398)) {
          local_3ec = 1;
        }
        if ((local_3e8.dims == 1) && (local_3e8.w == local_39c)) {
          local_3ec = 4;
        }
        if (((local_3e8.dims == 2) && (local_3e8.w == 1)) && (local_3e8.h == local_398)) {
          local_3ec = 2;
        }
        if (((local_3e8.dims == 2) && (local_3e8.w == local_39c)) && (local_3e8.h == local_398)) {
          local_3ec = 3;
        }
        if (((local_3e8.dims == 2) && (local_3e8.w == local_39c)) && (local_3e8.h == 1)) {
          local_3ec = 4;
        }
      }
    }
    else {
      local_1d8 = (value_type *)(in_RDI + 0x1b0);
      local_1d0 = &local_3e8;
      if (local_1d0 != local_1d8) {
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_1dc = 1;
          LOCK();
          local_1e0 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_3e8.data = local_1d8->data;
        local_3e8.refcount = *(int **)(in_RDI + 0x1b8);
        local_3e8.elemsize = *(size_t *)(in_RDI + 0x1c0);
        local_3e8.elempack = *(int *)(in_RDI + 0x1c8);
        local_3e8.allocator = *(Allocator **)(in_RDI + 0x1d0);
        local_3e8.d = *(int *)(in_RDI + 0x1e4);
        local_3e8.c = *(int *)(in_RDI + 0x1e8);
        local_3e8.cstep = *(size_t *)(in_RDI + 0x1f0);
        local_108 = local_1d0;
      }
      local_3ec = *(int *)(in_RDI + 0xf8);
      local_1c8 = local_1d0;
    }
    top_blob_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2a8,0);
    _c = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
    _w_00 = (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
    _w = (int)(in_stack_fffffffffffffae8 >> 0x20);
    if (*(int *)(in_RDI + 0x108) == 0) {
      if (*(int *)(in_RDI + 0xfc) == 0) {
        Mat::create(in_stack_fffffffffffffaf0,_w,(int)in_stack_fffffffffffffae8,
                    (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      }
      else {
        Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),_w_00,
                    (int)in_stack_fffffffffffffaf8,_c,in_stack_fffffffffffffae8,
                    in_stack_fffffffffffffae0);
      }
    }
    else if (*(int *)(in_RDI + 0xfc) == 0) {
      Mat::create(in_stack_fffffffffffffaf0,_w,(int)in_stack_fffffffffffffae8,
                  (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    }
    else {
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),_w_00,
                  (int)in_stack_fffffffffffffaf8,_c,in_stack_fffffffffffffae8,
                  in_stack_fffffffffffffae0);
    }
    bVar3 = true;
    if (top_blob_00->data != (void *)0x0) {
      bVar3 = top_blob_00->cstep * (long)top_blob_00->c == 0;
      local_8 = top_blob_00;
    }
    local_180 = top_blob_00;
    if (bVar3) {
      local_28c = -100;
    }
    else {
      gemm_transB(&local_310,&local_380,&local_3e8,top_blob_00,*(float *)(in_RDI + 0xd0),
                  *(float *)(in_RDI + 0xd4),local_3ec,*(int *)(in_RDI + 0x108),local_2b0);
      local_28c = 0;
    }
    pvVar4 = &local_3e8;
    local_270 = pvVar4;
    local_78 = pvVar4;
    if (local_3e8.refcount != (int *)0x0) {
      local_7c = 0xffffffff;
      LOCK();
      local_80 = *local_3e8.refcount;
      *local_3e8.refcount = *local_3e8.refcount + -1;
      UNLOCK();
      if (local_80 == 1) {
        if (local_3e8.allocator == (Allocator *)0x0) {
          local_70 = local_3e8.data;
          if (local_3e8.data != (void *)0x0) {
            free(local_3e8.data);
          }
        }
        else {
          (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
        }
      }
    }
    pvVar4->data = (void *)0x0;
    pvVar4->elemsize = 0;
    pvVar4->elempack = 0;
    pvVar4->dims = 0;
    pvVar4->w = 0;
    pvVar4->h = 0;
    pvVar4->d = 0;
    pvVar4->c = 0;
    pvVar4->cstep = 0;
    pvVar4->refcount = (int *)0x0;
    pvVar4 = &local_380;
    local_260 = pvVar4;
    local_98 = pvVar4;
    if (local_380.refcount != (int *)0x0) {
      local_9c = 0xffffffff;
      LOCK();
      local_a0 = *local_380.refcount;
      *local_380.refcount = *local_380.refcount + -1;
      UNLOCK();
      if (local_a0 == 1) {
        if (local_380.allocator == (Allocator *)0x0) {
          local_60 = local_380.data;
          if (local_380.data != (void *)0x0) {
            free(local_380.data);
          }
        }
        else {
          (*(local_380.allocator)->_vptr_Allocator[3])(local_380.allocator,local_380.data);
        }
      }
    }
    pvVar4->data = (void *)0x0;
    pvVar4->elemsize = 0;
    pvVar4->elempack = 0;
    pvVar4->dims = 0;
    pvVar4->w = 0;
    pvVar4->h = 0;
    pvVar4->d = 0;
    pvVar4->c = 0;
    pvVar4->cstep = 0;
    pvVar4->refcount = (int *)0x0;
    pvVar4 = &local_310;
    if (local_310.refcount != (int *)0x0) {
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *local_310.refcount;
      *local_310.refcount = *local_310.refcount + -1;
      UNLOCK();
      if (local_c0 == 1) {
        local_250 = pvVar4;
        local_b8 = pvVar4;
        if (local_310.allocator == (Allocator *)0x0) {
          local_50 = local_310.data;
          if (local_310.data != (void *)0x0) {
            free(local_310.data);
          }
        }
        else {
          (*(local_310.allocator)->_vptr_Allocator[3])(local_310.allocator,local_310.data);
        }
      }
    }
    pvVar4->data = (void *)0x0;
    pvVar4->elemsize = 0;
    pvVar4->elempack = 0;
    pvVar4->dims = 0;
    pvVar4->w = 0;
    pvVar4->h = 0;
    pvVar4->d = 0;
    pvVar4->c = 0;
    pvVar4->cstep = 0;
    pvVar4->refcount = (int *)0x0;
  }
  else {
    local_28c = forward_int8(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010
                            );
  }
  return local_28c;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif // NCNN_INT8

    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat BT;
    if (transB == 0)
    {
        // transpose B to col-major
        BT.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < BT.h; i++)
        {
            float* ptr = BT.row(i);
            for (int j = 0; j < BT.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        BT = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int N = BT.dims == 3 ? BT.c : BT.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB(A, BT, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}